

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,IxMit<(moira::Mode)10,_2> wrapper)

{
  uint uVar1;
  Syntax SVar2;
  i32 iVar3;
  Int IVar4;
  char *pcVar5;
  byte *pbVar6;
  Int IVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  sbyte sVar12;
  char cVar13;
  Rn rn;
  uint uVar14;
  short sVar15;
  ushort uVar16;
  uint uVar17;
  short local_3c;
  
  uVar1 = (wrapper.ea)->ext1;
  if ((uVar1 >> 8 & 1) == 0) {
    operator<<(this);
    pcVar10 = this->ptr;
    this->ptr = pcVar10 + 1;
    *pcVar10 = '@';
    pcVar10 = this->ptr;
    this->ptr = pcVar10 + 1;
    *pcVar10 = '(';
    operator<<(this,(Int)(int)(char)uVar1);
    pcVar10 = this->ptr;
    this->ptr = pcVar10 + 1;
    *pcVar10 = ',';
    uVar17 = uVar1 >> 9 & 3;
    operator<<(this,(Rn)(uVar1 >> 0xc & 0xf));
    pcVar10 = ":l";
    if ((uVar1 >> 0xb & 1) == 0) {
      pcVar10 = ":w";
    }
    cVar13 = *pcVar10;
    while (cVar13 != '\0') {
      pcVar10 = pcVar10 + 1;
      pcVar5 = this->ptr;
      this->ptr = pcVar5 + 1;
      *pcVar5 = cVar13;
      cVar13 = *pcVar10;
    }
    if ((uVar17 != 0) && (SVar2 = this->style->syntax, SVar2 < (MUSASHI|MOIRA_MIT))) {
      pcVar10 = this->ptr;
      this->ptr = pcVar10 + 1;
      *pcVar10 = (char)(0x2a3a2a3a2a >> ((byte)(SVar2 << 3) & 0x3f));
      pbVar6 = (byte *)this->ptr;
      this->ptr = (char *)(pbVar6 + 1);
      *pbVar6 = (byte)(1 << (sbyte)uVar17) | 0x30;
    }
    goto LAB_0028bb57;
  }
  uVar14 = uVar1 & 0xffff;
  rn.raw = uVar14 >> 0xc;
  uVar17 = uVar14 >> 0xb;
  uVar8 = uVar1 >> 9 & 3;
  uVar9 = uVar14 >> 7;
  uVar14 = uVar14 >> 6;
  uVar16 = (ushort)(uVar1 >> 4) & 3;
  iVar3 = (wrapper.ea)->ext2;
  sVar15 = (short)iVar3;
  sVar12 = (sbyte)uVar8;
  local_3c = (short)uVar8;
  if ((uVar1 & 7) == 0) {
    if ((uVar9 & 1) == 0) {
      operator<<();
    }
    else {
      operator<<(this);
    }
    pcVar10 = this->ptr;
    this->ptr = pcVar10 + 1;
    *pcVar10 = '@';
    pcVar10 = this->ptr;
    this->ptr = pcVar10 + 1;
    *pcVar10 = '(';
    IVar4.raw = (int)sVar15;
    if (uVar16 == 3) {
      IVar4.raw = iVar3;
    }
    operator<<(this,IVar4);
    if ((uVar14 & 1) != 0) goto LAB_0028bb57;
    pcVar10 = this->ptr;
    this->ptr = pcVar10 + 1;
    *pcVar10 = ',';
    SVar2 = this->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar10 = this->ptr;
      this->ptr = pcVar10 + 1;
      *pcVar10 = ' ';
    }
    operator<<(this,rn);
    pcVar10 = ":l";
    if ((uVar17 & 1) == 0) {
      pcVar10 = ":w";
    }
    cVar13 = *pcVar10;
    while (cVar13 != '\0') {
      pcVar10 = pcVar10 + 1;
      pcVar5 = this->ptr;
      this->ptr = pcVar5 + 1;
      *pcVar5 = cVar13;
      cVar13 = *pcVar10;
    }
  }
  else {
    IVar4.raw = (wrapper.ea)->ext3;
    if ((uVar1 & 4) == 0) {
      if ((uVar9 & 1) == 0) {
        operator<<();
      }
      else {
        operator<<(this);
      }
      pcVar10 = this->ptr;
      this->ptr = pcVar10 + 1;
      *pcVar10 = '@';
      pcVar10 = this->ptr;
      this->ptr = pcVar10 + 1;
      *pcVar10 = '(';
      IVar7.raw = (int)sVar15;
      if (uVar16 == 3) {
        IVar7.raw = iVar3;
      }
      operator<<(this,IVar7);
      if ((uVar14 & 1) == 0) {
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = ',';
        SVar2 = this->style->syntax;
        if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
          pcVar10 = this->ptr;
          this->ptr = pcVar10 + 1;
          *pcVar10 = ' ';
        }
        operator<<(this,rn);
        pcVar10 = ":l";
        if ((uVar17 & 1) == 0) {
          pcVar10 = ":w";
        }
        cVar13 = *pcVar10;
        while (cVar13 != '\0') {
          pcVar10 = pcVar10 + 1;
          pcVar5 = this->ptr;
          this->ptr = pcVar5 + 1;
          *pcVar5 = cVar13;
          cVar13 = *pcVar10;
        }
        if ((local_3c != 0) && (SVar2 = this->style->syntax, SVar2 < (MUSASHI|MOIRA_MIT))) {
          pcVar10 = this->ptr;
          this->ptr = pcVar10 + 1;
          *pcVar10 = (char)(0x2a3a2a3a2a >> ((byte)(SVar2 << 3) & 0x3f));
          pbVar6 = (byte *)this->ptr;
          this->ptr = (char *)(pbVar6 + 1);
          *pbVar6 = '\x01' << sVar12 | 0x30;
        }
      }
      cVar13 = ')';
      lVar11 = 1;
      do {
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = cVar13;
        cVar13 = ")@("[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      operator<<(this,IVar4);
      goto LAB_0028bb57;
    }
    if ((uVar9 & 1) == 0) {
      operator<<();
    }
    else {
      operator<<(this);
    }
    pcVar10 = this->ptr;
    this->ptr = pcVar10 + 1;
    *pcVar10 = '@';
    pcVar10 = this->ptr;
    this->ptr = pcVar10 + 1;
    *pcVar10 = '(';
    IVar7.raw = (int)sVar15;
    if (uVar16 == 3) {
      IVar7.raw = iVar3;
    }
    operator<<(this,IVar7);
    cVar13 = ')';
    lVar11 = 1;
    do {
      pcVar10 = this->ptr;
      this->ptr = pcVar10 + 1;
      *pcVar10 = cVar13;
      cVar13 = ")@("[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    operator<<(this,IVar4);
    if ((uVar14 & 1) != 0) goto LAB_0028bb57;
    pcVar10 = this->ptr;
    this->ptr = pcVar10 + 1;
    *pcVar10 = ',';
    SVar2 = this->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar10 = this->ptr;
      this->ptr = pcVar10 + 1;
      *pcVar10 = ' ';
    }
    operator<<(this,rn);
    pcVar10 = ":l";
    if ((uVar17 & 1) == 0) {
      pcVar10 = ":w";
    }
    cVar13 = *pcVar10;
    while (cVar13 != '\0') {
      pcVar10 = pcVar10 + 1;
      pcVar5 = this->ptr;
      this->ptr = pcVar5 + 1;
      *pcVar5 = cVar13;
      cVar13 = *pcVar10;
    }
  }
  if ((local_3c != 0) && (SVar2 = this->style->syntax, SVar2 < (MUSASHI|MOIRA_MIT))) {
    pcVar10 = this->ptr;
    this->ptr = pcVar10 + 1;
    *pcVar10 = (char)(0x2a3a2a3a2a >> ((byte)(SVar2 << 3) & 0x3f));
    pbVar6 = (byte *)this->ptr;
    this->ptr = (char *)(pbVar6 + 1);
    *pbVar6 = '\x01' << sVar12 | 0x30;
  }
LAB_0028bb57:
  pcVar10 = this->ptr;
  this->ptr = pcVar10 + 1;
  *pcVar10 = ')';
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(IxMit<M, S> wrapper)
{
    assert(M == Mode(6) || M == Mode(10));

    auto &ea = wrapper.ea;

    u16 full = _______x________ (ea.ext1);

    if (!full) {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 0  | DISPLACEMENT                         |
        // --------------------------------------------------------------------

        u16 reg   = xxxx____________ (ea.ext1);
        u16 lw    = ____x___________ (ea.ext1);
        u16 scale = _____xx_________ (ea.ext1);
        u16 disp  = ________xxxxxxxx (ea.ext1);

        M == Mode(10) ? *this << Pc{} : *this << An{ea.reg};
        *this << "@(" << Int{(i8)disp};
        *this << "," << Rn{reg} << (lw ? ":l" : ":w") << Scale{scale} << ")";

    } else {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 1  | BS | IS | BD SIZE  | 0  | IIS        |
        // --------------------------------------------------------------------

        u16  reg   = xxxx____________ (ea.ext1);
        u16  lw    = ____x___________ (ea.ext1);
        u16  scale = _____xx_________ (ea.ext1);
        u16  bs    = ________x_______ (ea.ext1);
        u16  is    = _________x______ (ea.ext1);
        u16  size  = __________xx____ (ea.ext1);
        u16  iis   = _____________xxx (ea.ext1);
        u32  base  = ea.ext2;
        u32  outer = ea.ext3;

        auto baseDisplacement = [&]() {
            size == 3 ? (*this << Int{(i32)base}) : (*this << Int{(i16)base});
        };
        auto baseRegister = [&]() {
            if constexpr (M == Mode(10)) {
                bs ? *this << Zpc{} : *this << Pc{};
            } else {
                if (!bs) *this << An{ea.reg};
            }
        };
        auto indexRegister = [&]() {
            if (!is) *this << Sep{} << Rn{reg} << (lw ? ":l" : ":w") << Scale{scale};
        };
        auto outerDisplacement = [&]() {
            *this << Int(outer);
        };

        if (iis == 0) {

            // Memory Indirect Unindexed
            baseRegister();
            *this << "@(";
            baseDisplacement(); indexRegister();
            *this << ")";

        } else if (iis & 0b100) {

            // Memory Indirect Postindexed
            baseRegister();
            *this << "@(";
            baseDisplacement();
            *this << ")@(";
            outerDisplacement(); indexRegister();
            *this << ")";

        } else {

            // Memory Indirect Preindexed
            baseRegister();
            *this << "@(";
            baseDisplacement(); indexRegister();
            *this << ")@(";
            outerDisplacement();
            *this << ")";
        }
    }

    return *this;
}